

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hh
# Opt level: O0

void __thiscall
tchecker::make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::make_array_t
          (make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *this,
          make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *array)

{
  rational<long> *prVar1;
  rational<long> *local_30;
  rational<long> *p;
  rational<long> *array_p;
  rational<long> *end;
  make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *array_local;
  make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *this_local;
  
  (this->super_clockval_base_t).super_array_capacity_t<unsigned_short>._capacity =
       (array->super_clockval_base_t).super_array_capacity_t<unsigned_short>._capacity;
  prVar1 = end_ptr(this);
  p = ptr(array);
  for (local_30 = ptr(this); local_30 != prVar1; local_30 = local_30 + 1) {
    local_30->num = p->num;
    local_30->den = p->den;
    p = p + 1;
  }
  return;
}

Assistant:

make_array_t(tchecker::make_array_t<T, T_ALLOCSIZE, BASE> const & array) : BASE(array)
  {
    T const * end = end_ptr();
    T const * array_p = array.ptr();
    for (T * p = ptr(); p != end; ++p, ++array_p)
      new (p) T(*array_p);
  }